

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O3

BOOL objc_layout_structure_next_member(objc_struct_layout *layout)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  size_t align;
  size_t local_48;
  size_t local_40;
  char *local_38;
  
  pcVar3 = layout->type;
  layout->record_size = 0;
  layout->record_align = 0;
  layout->prev_type = pcVar3;
  pcVar4 = layout->original_type + 1;
  do {
    cVar1 = *pcVar4;
    local_38 = pcVar3;
    if (cVar1 == '}') goto LAB_0011265b;
    pcVar4 = pcVar4 + 1;
  } while (cVar1 != '=');
  cVar1 = *pcVar4;
  if (cVar1 != '}') {
    do {
      pcVar3 = pcVar4;
      if (cVar1 == '\"') {
        pcVar4 = pcVar4 + 1;
        do {
          pcVar3 = pcVar4 + 1;
          cVar1 = *pcVar4;
          pcVar4 = pcVar3;
        } while (cVar1 != '\"');
      }
      local_48 = 0;
      local_40 = 0;
      pcVar4 = sizeof_type(pcVar3,&local_40);
      alignof_type(pcVar3,&local_48);
      if (layout->prev_type < pcVar3) {
        if (layout->record_align == 0) {
          layout->record_align = (uint)local_48;
          layout->type = pcVar3;
        }
      }
      else {
        uVar2 = layout->record_size;
        if ((local_48 != 0) && ((ulong)uVar2 % local_48 != 0)) {
          uVar2 = ((uint)local_48 + uVar2) - (int)((ulong)uVar2 % local_48);
        }
        layout->record_size = uVar2 + (int)local_40;
      }
      cVar1 = *pcVar4;
    } while (cVar1 != '}');
    pcVar3 = layout->type;
  }
LAB_0011265b:
  return pcVar3 != local_38;
}

Assistant:

OBJC_PUBLIC
BOOL objc_layout_structure_next_member(struct objc_struct_layout *layout)
{
	const char *end = layout->type;
	layout->record_size = 0;
	layout->record_align = 0;
	layout->prev_type = layout->type;
	const char *type = layout->original_type;
	parse_struct(&type, (type_parser)layout_structure_callback, layout);
	//printf("Calculated: (%s) %s %d %d\n", layout->original_type, layout->type, layout->record_size, layout->record_align);
	//printf("old start %s, new start %s\n", end, layout->type);
	return layout->type != end;
}